

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall metaf::CloudGroup::appendCeiling(CloudGroup *this,string *group)

{
  bool bVar1;
  int iVar2;
  AppendResult AVar3;
  smatch match;
  string_type local_60;
  optional<metaf::Distance> maxH;
  optional<metaf::Distance> minH;
  
  Distance::fromHeightString((optional<metaf::Distance> *)&match,group);
  if ((char)match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
    if (((char)match.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == '\0') &&
       (1 < (int)match.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start - 3U)) {
      return GROUP_INVALIDATED;
    }
    *(pointer *)&this->heightOrVertVis =
         match.
         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     &(this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged =
         match.
         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    this->incompleteText = CIG_NUM;
    return APPENDED;
  }
  if ((appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,"(\\d\\d\\d)V(\\d\\d\\d)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (group,&match,&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_60,&match,1);
    Distance::fromHeightString(&minH,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (minH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged != false) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_60,&match,2);
      Distance::fromHeightString(&maxH,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (maxH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::Distance>._M_engaged != false) {
        (this->heightOrVertVis).distModifier =
             minH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._0_4_;
        (this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)
             minH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._4_4_;
        *(undefined8 *)
         &(this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged =
             minH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._8_8_;
        (this->maxHt).distModifier =
             maxH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._0_4_;
        (this->maxHt).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)
             maxH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._4_4_;
        *(undefined8 *)
         &(this->maxHt).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged =
             maxH.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._8_8_;
        this->tp = VARIABLE_CEILING;
        this->incompleteText = CIG_NUM;
        AVar3 = APPENDED;
        goto LAB_0018aa14;
      }
    }
  }
  AVar3 = GROUP_INVALIDATED;
LAB_0018aa14:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return AVar3;
}

Assistant:

AppendResult CloudGroup::appendCeiling(const std::string & group) {
	if (const auto d = Distance::fromHeightString(group); d.has_value()) {
		if (!d->isReported()) return AppendResult::GROUP_INVALIDATED;
		heightOrVertVis = *d;
		incompleteText = IncompleteText::CIG_NUM;
		return AppendResult::APPENDED;
	}
	static const std::regex rgx ("(\\d\\d\\d)V(\\d\\d\\d)");
	static const auto matchMinHeight = 1, matchMaxHeight = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return AppendResult::GROUP_INVALIDATED;
	const auto minH = Distance::fromHeightString(match.str(matchMinHeight));
	if (!minH.has_value()) return AppendResult::GROUP_INVALIDATED;
	const auto maxH = Distance::fromHeightString(match.str(matchMaxHeight));
	if (!maxH.has_value()) return AppendResult::GROUP_INVALIDATED;
	heightOrVertVis = *minH;
	maxHt = *maxH;
	tp = Type::VARIABLE_CEILING;
	incompleteText = IncompleteText::CIG_NUM;
	return AppendResult::APPENDED;
}